

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  ImGuiDockContext *this;
  int *piVar1;
  byte bVar2;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar3;
  ImGuiDockRequest *pIVar4;
  uint uVar5;
  ImGuiContext_conflict1 *ctx;
  int iVar6;
  uint uVar7;
  ImGuiDockNode *dst_node;
  long lVar8;
  void *__dest;
  ImGuiWindowSettings *p;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  long lVar12;
  void *__src;
  ImGuiDockNode *pIVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  ulong __nmemb;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  uint local_78;
  void *pvStack_70;
  ulong local_58;
  
  ctx = GImGui;
  this = &GImGui->DockContext;
  uVar7 = 0;
  if (root_id == 0) {
    uVar9 = 0;
    dst_node = (ImGuiDockNode *)0x0;
    uVar11 = 0;
  }
  else {
    dst_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,root_id);
    if (dst_node == (ImGuiDockNode *)0x0) {
      return;
    }
    uVar9 = *(ushort *)&dst_node->field_0xbc & 7;
    uVar11 = *(ushort *)&dst_node->field_0xbc & 0x38;
  }
  local_78 = 0;
  pvStack_70 = (void *)0x0;
  iVar6 = (this->Nodes).Data.Size;
  if (iVar6 < 1) {
    bVar16 = 0;
  }
  else {
    __dest = (void *)0x0;
    __src = (void *)0x0;
    local_58 = 0;
    uVar7 = 0;
    lVar12 = 0;
    bVar16 = 0;
    do {
      src_node = (ImGuiDockNode *)(ctx->DockContext).Nodes.Data.Data[lVar12].field_1.val_p;
      if (src_node != (ImGuiDockNode *)0x0) {
        if (root_id == 0) {
          bVar16 = (*(byte *)((long)&src_node->MergedFlags + 1) & 8) >> 3 | bVar16;
LAB_0019ceac:
          uVar10 = (uint)local_58;
          if (uVar7 == uVar10) {
            if (uVar10 == 0) {
              uVar7 = 8;
            }
            else {
              uVar7 = ((int)((int)(local_58 >> 0x1f) + uVar10) >> 1) + uVar10;
            }
            uVar5 = uVar10 + 1;
            if ((int)(uVar10 + 1) < (int)uVar7) {
              uVar5 = uVar7;
            }
            local_58 = (ulong)uVar5;
            if (GImGui != (ImGuiContext_conflict1 *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            __dest = (*GImAllocatorAllocFunc)((long)(int)uVar5 << 3,GImAllocatorUserData);
            uVar7 = uVar10;
            pvStack_70 = __dest;
            if (__src != (void *)0x0) {
              memcpy(__dest,__src,(long)(int)uVar10 << 3);
              if (GImGui != (ImGuiContext_conflict1 *)0x0) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(__src,GImAllocatorUserData);
              uVar7 = local_78;
            }
          }
          *(ImGuiDockNode **)((long)__dest + (long)(int)uVar7 * 8) = src_node;
          uVar7 = local_78 + 1;
          iVar6 = (this->Nodes).Data.Size;
          __src = __dest;
          local_78 = uVar7;
        }
        else {
          pIVar3 = src_node;
          if (src_node->ID != root_id) {
            do {
              pIVar13 = pIVar3;
              pIVar3 = pIVar13->ParentNode;
            } while (pIVar3 != (ImGuiDockNode *)0x0);
            if (pIVar13->ID == root_id) {
              bVar2 = *(byte *)((long)&src_node->MergedFlags + 1);
              lVar8 = (long)(ctx->DockContext).Requests.Size;
              if (0 < lVar8) {
                pIVar4 = (ctx->DockContext).Requests.Data;
                lVar14 = 0;
                do {
                  if (*(ImGuiDockNode **)((long)&pIVar4->DockTargetNode + lVar14) == src_node) {
                    *(undefined4 *)((long)&pIVar4->Type + lVar14) = 0;
                  }
                  lVar14 = lVar14 + 0x40;
                } while (lVar8 * 0x40 != lVar14);
              }
              bVar16 = (bVar2 & 8) >> 3 | bVar16;
              if (root_id != 0) {
                DockNodeMoveWindows(dst_node,src_node);
                DockSettingsRenameNodeReferences(src_node->ID,dst_node->ID);
              }
              goto LAB_0019ceac;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar6);
  }
  if (root_id != 0) {
    *(ushort *)&dst_node->field_0xbc =
         uVar11 | uVar9 | (ushort)*(undefined4 *)&dst_node->field_0xbc & 0xffc0;
  }
  p = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
  if (p != (ImGuiWindowSettings *)0x0) {
    p = (ImGuiWindowSettings *)&p->Pos;
  }
  __nmemb = (ulong)uVar7;
  for (; p != (ImGuiWindowSettings *)0x0;
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,p)) {
    if ((p->DockId != 0) && (0 < (int)uVar7)) {
      uVar15 = 0;
      do {
        if (**(ImGuiID **)((long)pvStack_70 + uVar15 * 8) == p->DockId) {
          p->DockId = root_id;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (__nmemb != uVar15);
    }
  }
  if ((int)uVar7 < 2) {
    if (uVar7 != 1) goto LAB_0019d069;
  }
  else {
    qsort(pvStack_70,__nmemb,8,DockNodeComparerDepthMostFirst);
  }
  uVar15 = 0;
  do {
    DockContextRemoveNode(ctx,*(ImGuiDockNode **)((long)pvStack_70 + uVar15 * 8),false);
    uVar15 = uVar15 + 1;
  } while (uVar15 < __nmemb);
LAB_0019d069:
  if (root_id == 0) {
    ImGuiStorage::Clear(&this->Nodes);
    pIVar4 = (ctx->DockContext).Requests.Data;
    if (pIVar4 != (ImGuiDockRequest *)0x0) {
      (ctx->DockContext).Requests.Size = 0;
      (ctx->DockContext).Requests.Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      (ctx->DockContext).Requests.Data = (ImGuiDockRequest *)0x0;
    }
  }
  else if (bVar16 != 0) {
    dst_node->CentralNode = dst_node;
    uVar7 = dst_node->LocalFlags | 0x800;
    dst_node->LocalFlags = uVar7;
    dst_node->MergedFlags = dst_node->SharedFlags | dst_node->LocalFlagsInWindows | uVar7;
  }
  if (pvStack_70 != (void *)0x0) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pvStack_70,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                {
                    DockNodeMoveWindows(root_node, node);
                    DockSettingsRenameNodeReferences(node->ID, root_node->ID);
                }
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->CentralNode = root_node;
        root_node->SetLocalFlags(root_node->LocalFlags | ImGuiDockNodeFlags_CentralNode);
    }
}